

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

void aura_call_fail(aura_node *node,aura_object *o)

{
  if ((o->pending != 0) &&
     (o->calldonecb != (_func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *)0x0)) {
    (*o->calldonecb)(node,2,(aura_buffer *)0x0,o->arg);
  }
  if (o->pending != 0) {
    o->pending = o->pending + -1;
  }
  node->sync_call_result = 2;
  node->sync_ret_buf = (aura_buffer *)0x0;
  return;
}

Assistant:

void aura_call_fail(struct aura_node *node, struct aura_object *o)
{
	if (o->pending && o->calldonecb)
		o->calldonecb(node, AURA_CALL_TRANSPORT_FAIL, NULL, o->arg);
	if (o->pending)
		o->pending--;

	node->sync_call_result = AURA_CALL_TRANSPORT_FAIL;
	node->sync_ret_buf = NULL;
}